

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O1

void init_noise(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  double local_20;
  double local_18;
  double local_10;
  
  lVar5 = 0;
  srand(0);
  piVar3 = (int *)operator_new__(0x4000);
  hash_table = piVar3;
  do {
    piVar3[lVar5] = (int)lVar5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1000);
  uVar6 = 0x1000;
  do {
    iVar1 = rand();
    piVar3 = hash_table;
    iVar2 = (int)(((double)iVar1 / 2147483647.0) * 4096.0);
    iVar1 = hash_table[uVar6 - 1];
    hash_table[uVar6 - 1] = hash_table[iVar2];
    piVar3[iVar2] = iVar1;
    uVar6 = uVar6 - 1;
  } while (1 < uVar6);
  pdVar4 = (double *)operator_new__(0x858);
  lVar5 = 0;
  noise_table = pdVar4;
  do {
    local_20 = (double)(int)lVar5 * 0.12345;
    local_18 = local_20;
    local_10 = local_20;
    lVar7 = 0;
    uVar6 = 0;
    do {
      uVar8 = (uint)crctab[(byte)((byte)uVar6 ^ *(byte *)((long)&local_20 + lVar7))] ^
              (uint)(uVar6 >> 8);
      uVar6 = (ulong)uVar8;
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 != 0x18);
    pdVar4[lVar5] = (double)uVar8 * 3.0518043793392844e-05 + -1.0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10b);
  return;
}

Assistant:

void init_noise()
{
   int   i, j, k;
   Vector rp;

   srand(0);
   //
   // Init hash table
   //
   hash_table = new int [4096];
   for( i = 0; i <   4096; i++ )
      hash_table[i] =   i;

   for( i = 4095; i > 0; i-- )
   {
      j =   (int)(rnd() * 4096.0);
      k =   hash_table[i];
      hash_table[i] =   hash_table[j];
      hash_table[j] =   k;
   }
   //
   // Init noise table
   //
   noise_table = new double [max_noise_size];

   for( i = 0; i <   max_noise_size;   i++   )
   {
      rp = (double)i;
      noise_table[i] = R(rp) * REALSCALE - 1.0;

#if   !defined(FINAL)
//    printf("NoiseTable[%d] == %g\n",i,NoiseTable[i]);
#endif

   }
}